

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O2

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::LinearDerivateCase
          (LinearDerivateCase *this,TestContext *testCtx,string *name,string *description,
          DerivateFunc func,DataType type,Precision precision,SurfaceType surfaceType,int numSamples
          ,string *fragmentSrcTmpl,BaseUniformType usedDefaultUniform)

{
  DerivateUniformSetup *this_00;
  
  this_00 = (DerivateUniformSetup *)operator_new(0x18);
  DerivateUniformSetup::DerivateUniformSetup(this_00,false);
  (this_00->super_UniformSetup)._vptr_UniformSetup = (_func_int **)&PTR__UniformSetup_00bd1950;
  *(BaseUniformType *)&this_00->field_0x14 = usedDefaultUniform;
  TriangleDerivateCase::TriangleDerivateCase
            (&this->super_TriangleDerivateCase,testCtx,name,description,(UniformSetup *)this_00);
  (this->super_TriangleDerivateCase).super_ShaderRenderCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__LinearDerivateCase_00bd18f0;
  std::__cxx11::string::string((string *)&this->m_fragmentTmpl,(string *)fragmentSrcTmpl);
  (this->super_TriangleDerivateCase).m_definitions.func = func;
  (this->super_TriangleDerivateCase).m_definitions.dataType = type;
  (this->super_TriangleDerivateCase).m_definitions.precision = precision;
  (this->super_TriangleDerivateCase).m_definitions.coordDataType = type;
  (this->super_TriangleDerivateCase).m_definitions.coordPrecision = precision;
  (this->super_TriangleDerivateCase).m_definitions.surfaceType = surfaceType;
  (this->super_TriangleDerivateCase).m_definitions.numSamples = numSamples;
  return;
}

Assistant:

LinearDerivateCase::LinearDerivateCase (tcu::TestContext&		testCtx,
										const std::string&		name,
										const std::string&		description,
										DerivateFunc			func,
										glu::DataType			type,
										glu::Precision			precision,
										SurfaceType				surfaceType,
										int						numSamples,
										const std::string&		fragmentSrcTmpl,
										BaseUniformType			usedDefaultUniform)
	: TriangleDerivateCase	(testCtx, name, description, new LinearDerivateUniformSetup(false, usedDefaultUniform))
	, m_fragmentTmpl		(fragmentSrcTmpl)
{
	m_definitions.func				= func;
	m_definitions.dataType			= type;
	m_definitions.precision			= precision;
	m_definitions.coordDataType		= m_definitions.dataType;
	m_definitions.coordPrecision	= m_definitions.precision;
	m_definitions.surfaceType		= surfaceType;
	m_definitions.numSamples		= numSamples;
}